

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char *txt)

{
  size_t sVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  string local_40;
  
  if (this == (lest *)0x0) {
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"{null string}","");
    sVar4 = local_98;
    paVar3 = &local_70;
    if (local_a0 == &local_90) {
      local_70._8_8_ = local_90._8_8_;
      _Var2._M_p = (pointer)paVar3;
    }
    else {
      local_80 = local_a0;
      _Var2._M_p = (pointer)local_a0;
    }
    local_70._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
    local_70._M_local_buf[0] = local_90._M_local_buf[0];
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p == paVar3) {
      _Var2._M_p = (pointer)&local_b0;
      local_b0._8_8_ = local_70._8_8_;
    }
    local_b0._M_allocated_capacity = local_70._M_allocated_capacity;
    psVar5 = &local_78;
    local_a0 = &local_90;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    sVar1 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,this,this + sVar1);
    make_strg_string(&local_40,&local_60);
    paVar3 = &local_40.field_2;
    _Var2._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == paVar3) {
      local_b0._8_8_ = local_40.field_2._8_8_;
      _Var2._M_p = (pointer)&local_b0;
    }
    local_b0._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    psVar5 = &local_40._M_string_length;
    sVar4 = local_40._M_string_length;
  }
  (((string *)(psVar5 + -1))->_M_dataplus)._M_p = (pointer)paVar3;
  *psVar5 = 0;
  paVar3->_M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p == &local_b0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b0._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b0._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = _Var2._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b0._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar4;
  local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
  if (this == (lest *)0x0) {
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70._M_allocated_capacity + 1);
    }
    if (local_a0 == &local_90) {
      return __return_storage_ptr__;
    }
    local_60.field_2._M_allocated_capacity =
         CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]);
    _Var2._M_p = (pointer)local_a0;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var2._M_p,local_60.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( char    const * const   txt ) { return txt ? make_strg_string( txt ) : "{null string}"; }